

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O0

void __thiscall
slang::syntax::
SyntaxVisitor<slang::ast::Expression::findPotentiallyImplicitNets(slang::syntax::SyntaxNode_const&,slang::ast::ASTContext_const&,slang::SmallVectorBase<slang::parsing::Token>&)::Visitor>
::visitDefault<slang::syntax::ForwardTypedefDeclarationSyntax_const&>
          (SyntaxVisitor<slang::ast::Expression::findPotentiallyImplicitNets(slang::syntax::SyntaxNode_const&,slang::ast::ASTContext_const&,slang::SmallVectorBase<slang::parsing::Token>&)::Visitor>
           *this,ForwardTypedefDeclarationSyntax *node)

{
  bool bVar1;
  size_t sVar2;
  undefined1 local_38 [8];
  Token token;
  SyntaxNode *child;
  uint32_t i;
  ForwardTypedefDeclarationSyntax *node_local;
  SyntaxVisitor<Visitor> *this_local;
  
  for (child._4_4_ = 0; sVar2 = SyntaxNode::getChildCount((SyntaxNode *)node), child._4_4_ < sVar2;
      child._4_4_ = child._4_4_ + 1) {
    token.info = (Info *)SyntaxNode::childNode((SyntaxNode *)node,(ulong)child._4_4_);
    if ((SyntaxNode *)token.info == (SyntaxNode *)0x0) {
      _local_38 = SyntaxNode::childToken((SyntaxNode *)node,(ulong)child._4_4_);
      bVar1 = parsing::Token::operator_cast_to_bool((Token *)local_38);
      if (bVar1) {
        SyntaxVisitor<Visitor>::visitToken((SyntaxVisitor<Visitor> *)this,_local_38);
      }
    }
    else {
      SyntaxNode::
      visit<slang::ast::Expression::findPotentiallyImplicitNets(slang::syntax::SyntaxNode_const&,slang::ast::ASTContext_const&,slang::SmallVectorBase<slang::parsing::Token>&)::Visitor>
                ((SyntaxNode *)token.info,(Visitor *)this);
    }
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }